

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferSTL.cpp
# Opt level: O3

void __thiscall adios2::format::BufferSTL::Resize(BufferSTL *this,size_t size,string *hint)

{
  value_type local_e8 [192];
  
  std::vector<char,_std::allocator<char>_>::reserve(&this->m_Buffer,size);
  local_e8[0] = '\0';
  std::vector<char,_std::allocator<char>_>::resize(&this->m_Buffer,size,local_e8);
  return;
}

Assistant:

void BufferSTL::Resize(const size_t size, const std::string hint)
{
    try
    {
        // doing this will effectively replace the STL GNU default power of 2
        // reallocation.
        m_Buffer.reserve(size);
        // must initialize memory (secure)
        m_Buffer.resize(size, '\0');
    }
    catch (...)
    {
        // catch a bad_alloc
        helper::ThrowNested<std::runtime_error>(
            "Toolkit::Format", "buffer::heap::BufferSTL", "BufferSystemV",
            "buffer overflow when resizing to " + std::to_string(size) + " bytes, " + hint);
    }
}